

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data-source-dos.cc
# Opt level: O0

void __thiscall DataSourceDOS::~DataSourceDOS(DataSourceDOS *this)

{
  DataSourceDOS *this_local;
  
  (this->super_DataSourceLegacy).super_DataSourceBase.super_Source._vptr_Source =
       (_func_int **)&PTR_get_name_abi_cxx11__001a4ca8;
  std::vector<DataSourceDOS::DataEntry,_std::allocator<DataSourceDOS::DataEntry>_>::~vector
            (&this->entries);
  std::shared_ptr<Buffer>::~shared_ptr(&this->spae);
  DataSourceLegacy::~DataSourceLegacy(&this->super_DataSourceLegacy);
  return;
}

Assistant:

DataSourceDOS::~DataSourceDOS() {
}